

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

void Abc_ZddPrintTest(Abc_ZddMan *p)

{
  int b;
  uint uVar1;
  uint uVar2;
  int local_64;
  int Union;
  int Set;
  int i;
  int pSets [3] [5];
  int Size;
  int nSets;
  Abc_ZddMan *p_local;
  
  pSets[2][4] = 5;
  memcpy(&Set,&DAT_00cc8d40,0x3c);
  local_64 = 0;
  for (Union = 0; Union < 3; Union = Union + 1) {
    Abc_ZddPermPrint(&Set + (long)Union * 5,pSets[2][4]);
    b = Abc_ZddBuildSet(p,&Set + (long)Union * 5,pSets[2][4]);
    local_64 = Abc_ZddUnion(p,local_64,b);
  }
  printf("Resulting set:\n");
  Abc_ZddPrint(p,local_64);
  printf("\n");
  uVar1 = Abc_ZddCountNodes(p,local_64);
  uVar2 = Abc_ZddCountPaths(p,local_64);
  printf("Nodes = %d.   Path = %d.\n",(ulong)uVar1,(ulong)uVar2);
  return;
}

Assistant:

void Abc_ZddPrintTest( Abc_ZddMan * p )
{
//    int nSets = 2;
//    int Size = 2;
//    int pSets[2][2] = { {5, 0}, {3, 11} };
    int nSets = 3;
    int Size = 5;
    int pSets[3][5] = { {5, 0, 2, 10, 7}, {3, 11, 10, 7, 2}, {0, 2, 5, 10, 7} };
    int i, Set, Union = 0;
    for ( i = 0; i < nSets; i++ )
    {
        Abc_ZddPermPrint( pSets[i], Size );
        Set = Abc_ZddBuildSet( p, pSets[i], Size );
        Union = Abc_ZddUnion( p, Union, Set );
    }
    printf( "Resulting set:\n" );
    Abc_ZddPrint( p, Union );
    printf( "\n" );
    printf( "Nodes = %d.   Path = %d.\n", Abc_ZddCountNodes(p, Union), Abc_ZddCountPaths(p, Union) );
    Size = 0;
}